

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_utils.h
# Opt level: O1

pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> __thiscall
HandleInfo<XrFoveationProfileFB_T_*>::getWithInstanceInfo
          (HandleInfo<XrFoveationProfileFB_T_*> *this,XrFoveationProfileFB_T *handle)

{
  ulong uVar1;
  GenValidUsageXrHandleInfo *pGVar2;
  GenValidUsageXrInstanceInfo *pGVar3;
  _Hash_node_base *p_Var4;
  ulong uVar5;
  __hash_code __code;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar8;
  UniqueLock lock;
  string local_48;
  unique_lock<std::mutex> local_28;
  
  if (handle == (XrFoveationProfileFB_T *)0x0) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Null handle passed to HandleInfoBase::getWithInstanceInfo()","")
    ;
    reportInternalError(&local_48);
  }
  local_28._M_device =
       &(this->super_HandleInfoBase<XrFoveationProfileFB_T_*,_GenValidUsageXrHandleInfo>).
        dispatch_mutex_;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  uVar1 = (this->super_HandleInfoBase<XrFoveationProfileFB_T_*,_GenValidUsageXrHandleInfo>).
          info_map_._M_h._M_bucket_count;
  uVar5 = (ulong)handle % uVar1;
  p_Var6 = (this->super_HandleInfoBase<XrFoveationProfileFB_T_*,_GenValidUsageXrHandleInfo>).
           info_map_._M_h._M_buckets[uVar5];
  p_Var7 = (__node_base_ptr)0x0;
  if ((p_Var6 != (__node_base_ptr)0x0) &&
     (p_Var4 = p_Var6->_M_nxt, p_Var7 = p_Var6,
     (XrFoveationProfileFB_T *)p_Var6->_M_nxt[1]._M_nxt != handle)) {
    while (p_Var6 = p_Var4, p_Var4 = p_Var6->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
      p_Var7 = (__node_base_ptr)0x0;
      if (((ulong)p_Var4[1]._M_nxt % uVar1 != uVar5) ||
         (p_Var7 = p_Var6, (XrFoveationProfileFB_T *)p_Var4[1]._M_nxt == handle)) goto LAB_002cb99b;
    }
    p_Var7 = (__node_base_ptr)0x0;
  }
LAB_002cb99b:
  if (p_Var7 == (__node_base_ptr)0x0) {
    p_Var4 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var4 = p_Var7->_M_nxt;
  }
  if (p_Var4 == (_Hash_node_base *)0x0) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,
               "Handle passed to HandleInfoBase::getWithInstanceInfo() not inserted","");
    reportInternalError(&local_48);
  }
  pGVar2 = (GenValidUsageXrHandleInfo *)p_Var4[2]._M_nxt;
  pGVar3 = pGVar2->instance_info;
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  pVar8.second = pGVar3;
  pVar8.first = pGVar2;
  return pVar8;
}

Assistant:

inline std::pair<GenValidUsageXrHandleInfo *, GenValidUsageXrInstanceInfo *> HandleInfo<HandleType>::getWithInstanceInfo(
    HandleType handle) {
    if (handle == XR_NULL_HANDLE) {
        reportInternalError("Null handle passed to HandleInfoBase::getWithInstanceInfo()");
    }
    // Try to find the handle in the appropriate map
    UniqueLock lock(this->dispatch_mutex_);
    auto entry_returned = this->info_map_.find(handle);
    if (entry_returned == this->info_map_.end()) {
        reportInternalError("Handle passed to HandleInfoBase::getWithInstanceInfo() not inserted");
    }
    GenValidUsageXrHandleInfo *info = entry_returned->second.get();
    GenValidUsageXrInstanceInfo *instance_info = info->instance_info;
    return {info, instance_info};
}